

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  pointer __s1;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  EnumDescriptorProto *enum_type;
  DescriptorProto *message;
  ServiceDescriptorProto *service;
  FileOptions *options;
  FileDescriptorProto *containing_file;
  size_type __rlen;
  string_view text;
  LocationRecorder location;
  LocationRecorder local_40;
  
  containing_file = (FileDescriptorProto *)0x0;
  text._M_str = ";";
  text._M_len = 1;
  bVar2 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (bVar2) {
    return true;
  }
  __s1 = (this->input_->current_).text._M_dataplus._M_p;
  sVar1 = (this->input_->current_).text._M_string_length;
  if (sVar1 == 4) {
    iVar3 = bcmp(__s1,"enum",4);
    if (iVar3 != 0) goto LAB_001ca75d;
    LocationRecorder::LocationRecorder
              (&local_40,root_location,5,*(int *)((long)&file->field_0 + 0x40));
    enum_type = (EnumDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
    bVar2 = ParseEnumDefinition(this,enum_type,&local_40,file);
  }
  else if (sVar1 == 6) {
    iVar3 = bcmp(__s1,"extend",6);
    if (iVar3 == 0) {
      LocationRecorder::LocationRecorder(&local_40,root_location,7);
      bVar2 = ParseExtend(this,&(file->field_0)._impl_.extension_,
                          &(file->field_0)._impl_.message_type_,root_location,4,&local_40,file);
    }
    else {
      iVar3 = bcmp(__s1,"import",6);
      if (iVar3 == 0) {
        bVar2 = ParseImport(this,&(file->field_0)._impl_.dependency_,
                            &(file->field_0)._impl_.public_dependency_,
                            &(file->field_0)._impl_.weak_dependency_,root_location,file);
        return bVar2;
      }
      iVar3 = bcmp(__s1,"option",6);
      if (iVar3 != 0) goto LAB_001ca75d;
      LocationRecorder::LocationRecorder(&local_40,root_location,8);
      options = FileDescriptorProto::mutable_options(file);
      bVar2 = ParseOption(this,&options->super_Message,&local_40,file,OPTION_STATEMENT);
    }
  }
  else {
    if (sVar1 != 7) {
LAB_001ca75d:
      RecordError(this,(ErrorMaker)ZEXT816(0x3432a8));
      return false;
    }
    iVar3 = bcmp(__s1,"message",7);
    if (iVar3 == 0) {
      LocationRecorder::LocationRecorder
                (&local_40,root_location,4,*(int *)((long)&file->field_0 + 0x28));
      this->recursion_depth_ = 0x20;
      message = (DescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
      bVar2 = ParseMessageDefinition(this,message,&local_40,file);
    }
    else {
      iVar3 = bcmp(__s1,"service",7);
      if (iVar3 != 0) {
        iVar3 = bcmp(__s1,"package",7);
        if (iVar3 == 0) {
          bVar2 = ParsePackage(this,file,root_location,containing_file);
          return bVar2;
        }
        goto LAB_001ca75d;
      }
      LocationRecorder::LocationRecorder
                (&local_40,root_location,6,*(int *)((long)&file->field_0 + 0x58));
      service = (ServiceDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::ServiceDescriptorProto>);
      bVar2 = ParseServiceDefinition(this,service,&local_40,file);
    }
  }
  LocationRecorder::~LocationRecorder(&local_40);
  return bVar2;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kMessageTypeFieldNumber,
                              file->message_type_size());
    // Maximum depth allowed by the DescriptorPool.
    recursion_depth_ = internal::cpp::MaxMessageDeclarationNestingDepth();
    return ParseMessageDefinition(file->add_message_type(), location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kEnumTypeFieldNumber,
                              file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location, file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kServiceFieldNumber,
                              file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(
        file->mutable_extension(), file->mutable_message_type(), root_location,
        FileDescriptorProto::kMessageTypeFieldNumber, location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(), root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    RecordError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}